

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O2

void pelelm_derconcentration
               (Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
               Real param_7,int *param_8,int param_9)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  long lVar25;
  double *pdVar26;
  double *pdVar27;
  double *pdVar28;
  Real Yt [9];
  double local_118 [10];
  double local_c8 [10];
  double local_78 [8];
  undefined1 *local_38;
  
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar14 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar10 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar3) + 1);
  lVar21 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1);
  iVar5 = (bx->smallend).vect[0];
  lVar22 = (long)iVar5;
  lVar17 = (long)(bx->smallend).vect[1];
  lVar25 = (long)(bx->smallend).vect[2];
  iVar6 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar19 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar6) + 1);
  iVar7 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar11 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1);
  iVar8 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar12 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar8) + 1);
  pdVar23 = (double *)
            (((lVar25 * 8 + dcomp * lVar19 * 8 + (long)iVar6 * -8) * lVar11 + lVar17 * 8 +
             (long)iVar7 * -8) * lVar12 + lVar22 * 8 + (long)iVar8 * -8 +
            (long)(derfab->super_BaseFab<double>).dptr);
  lVar11 = lVar11 * lVar12;
  pdVar9 = (datfab->super_BaseFab<double>).dptr;
  lVar20 = lVar10 * lVar14;
  iVar6 = (bx->bigend).vect[0];
  iVar7 = (bx->bigend).vect[1];
  iVar8 = (bx->bigend).vect[2];
  pdVar15 = (double *)
            (((lVar21 * 0x10 + lVar25 * 8 + (long)iVar4 * -8) * lVar10 + lVar17 * 8 +
             (long)iVar3 * -8) * lVar14 + lVar22 * 8 + (long)iVar2 * -8 + (long)pdVar9);
  for (; lVar25 <= iVar8; lVar25 = lVar25 + 1) {
    pdVar24 = pdVar23;
    pdVar27 = pdVar15;
    for (lVar10 = lVar17; lVar10 <= iVar7; lVar10 = lVar10 + 1) {
      if (iVar5 <= iVar6) {
        lVar13 = lVar22;
        pdVar16 = pdVar24;
        pdVar26 = pdVar27;
        do {
          local_c8[6] = 0.0;
          local_c8[7] = 0.0;
          local_c8[4] = 0.0;
          local_c8[5] = 0.0;
          local_c8[8] = 0.0;
          local_c8[2] = 0.0;
          local_c8[3] = 0.0;
          local_c8[0] = 0.0;
          local_c8[1] = 0.0;
          local_118[6] = 0.0;
          local_118[7] = 0.0;
          local_118[4] = 0.0;
          local_118[5] = 0.0;
          local_118[2] = 0.0;
          local_118[3] = 0.0;
          local_118[8] = 0.0;
          local_118[0] = 0.0;
          local_118[1] = 0.0;
          dVar1 = pdVar9[(lVar25 - iVar4) * lVar20 + (lVar10 - iVar3) * lVar14 + (lVar13 - iVar2)];
          pdVar28 = pdVar26;
          for (lVar18 = 0; lVar18 != 9; lVar18 = lVar18 + 1) {
            local_c8[lVar18] = *pdVar28 * (1.0 / dVar1);
            pdVar28 = pdVar28 + lVar21 * lVar20;
          }
          local_78[0] = 0.49603174603174605;
          local_78[1] = 0.03125195324707794;
          local_78[2] = 0.055509297807382736;
          local_78[3] = 0.9920634920634921;
          local_78[4] = 0.06250390649415588;
          local_78[5] = 0.05879931792791203;
          local_78[6] = 0.030297521662727988;
          local_78[7] = 0.029399658963956014;
          local_38 = &DAT_3fa246cdaf410bdd;
          for (lVar18 = 0; lVar18 != 9; lVar18 = lVar18 + 1) {
            local_118[lVar18] = local_c8[lVar18] * dVar1 * 0.001 * local_78[lVar18];
          }
          pdVar28 = pdVar16;
          for (lVar18 = 0; lVar18 != 9; lVar18 = lVar18 + 1) {
            *pdVar28 = local_118[lVar18] * 1000000.0;
            pdVar28 = pdVar28 + lVar11 * lVar19;
          }
          lVar13 = lVar13 + 1;
          pdVar26 = pdVar26 + 1;
          pdVar16 = pdVar16 + 1;
        } while (iVar6 + 1 != (int)lVar13);
      }
      pdVar27 = pdVar27 + lVar14;
      pdVar24 = pdVar24 + lVar12;
    }
    pdVar15 = pdVar15 + lVar20;
    pdVar23 = pdVar23 + lVar11;
  }
  return;
}

Assistant:

void pelelm_derconcentration (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                              const FArrayBox& datfab, const Geometry& /*geomdata*/,
                              Real /*time*/, const int* /*bcrec*/, int /*level*/)

{   
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(Box(datfab.box()).enclosedCells().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+2);
    AMREX_ASSERT(ncomp == NUM_SPECIES);
    auto const in_dat = datfab.array();
    auto          der = derfab.array(dcomp);
    amrex::ParallelFor(bx, 
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {   
        amrex::Real Yt[NUM_SPECIES] = {0.0};
        amrex::Real Ct[NUM_SPECIES] = {0.0};
        amrex::Real rhoinv = 1.0 / in_dat(i,j,k,0);
        for (int n = 0; n < NUM_SPECIES; n++) {
          Yt[n] = in_dat(i,j,k,n+2) * rhoinv;
        }
        amrex::Real Temp = in_dat(i,j,k,1);
        amrex::Real Rho = in_dat(i,j,k,0) * 1.0e-3; // ! kg/m^3 -> g/cm^3
        auto eos = pele::physics::PhysicsType::eos();
        eos.RTY2C(Rho,Temp,Yt,Ct);
        for (int n = 0; n < NUM_SPECIES; n++) {
          der(i,j,k,n) = Ct[n] * 1.0e6; // cm^(-3) -> m^(-3)
        }
    });
}